

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_parser.cpp
# Opt level: O3

void __thiscall
Importer_resolveSineModelFromFile_Test::TestBody(Importer_resolveSineModelFromFile_Test *this)

{
  char cVar1;
  char *pcVar2;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  ModelPtr model;
  ParserPtr p;
  long *local_88;
  long *local_80;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  long local_70 [2];
  AssertionResult local_60;
  long local_50 [2];
  AssertHelper local_40 [8];
  string local_38 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  undefined1 local_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  libcellml::Parser::create(SUB81(local_28,0));
  local_80 = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"sine_approximations.xml","");
  fileContents((string *)&local_60);
  libcellml::Parser::parseModel(local_38);
  if ((long *)CONCAT71(local_60._1_7_,local_60.success_) != local_50) {
    operator_delete((long *)CONCAT71(local_60._1_7_,local_60.success_),local_50[0] + 1);
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  local_80 = (long *)0x0;
  local_88 = (long *)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_60,"size_t(0)","p->issueCount()",(unsigned_long *)&local_80,
             (unsigned_long *)&local_88);
  if (local_60.success_ == false) {
    testing::Message::Message((Message *)&local_80);
    if (local_60.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_60.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/file_parser.cpp"
               ,0x22,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if (local_80 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_80 != (long *)0x0)) {
        (**(code **)(*local_80 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_60.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cVar1 = libcellml::Model::hasUnresolvedImports();
  local_80 = (long *)(CONCAT71(local_80._1_7_,cVar1) ^ 1);
  local_78.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar1 != '\0') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_60,(char *)&local_80,"model->hasUnresolvedImports()","true");
    testing::internal::AssertHelper::AssertHelper
              (local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/file_parser.cpp"
               ,0x23,(char *)CONCAT71(local_60._1_7_,local_60.success_));
    testing::internal::AssertHelper::operator=(local_40,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_40);
    if ((long *)CONCAT71(local_60._1_7_,local_60.success_) != local_50) {
      operator_delete((long *)CONCAT71(local_60._1_7_,local_60.success_),local_50[0] + 1);
    }
    if (local_88 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_88 != (long *)0x0)) {
        (**(code **)(*local_88 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return;
}

Assistant:

TEST(Importer, resolveSineModelFromFile)
{
    libcellml::ParserPtr p = libcellml::Parser::create();
    libcellml::ModelPtr model = p->parseModel(fileContents("sine_approximations.xml"));

    EXPECT_EQ(size_t(0), p->issueCount());
    EXPECT_FALSE(model->hasUnresolvedImports());
}